

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (*(long *)this != 0) {
    uVar4 = 0;
    do {
      uVar5 = *(ulong *)(this + 8);
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          lVar1 = *(long *)(this + 0x10);
          iVar2 = rand();
          *(byte *)(uVar3 + uVar5 * uVar4 + lVar1) = (byte)iVar2 & 1;
          uVar3 = uVar3 + 1;
          uVar5 = *(ulong *)(this + 8);
        } while (uVar3 < uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)this);
  }
  return;
}

Assistant:

void MatchMatrix::Randomize() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      b = static_cast<char>(rand() & 1);  // NOLINT
    }
  }
}